

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O1

void __thiscall
cnn::SimpleExecutionEngine::backward(SimpleExecutionEngine *this,VariableIndex *from_where)

{
  uint *puVar1;
  uint uVar2;
  pointer pTVar3;
  ComputationGraph *pCVar4;
  pointer pTVar5;
  pointer pVVar6;
  pointer ppNVar7;
  Node *pNVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  float *pfVar13;
  pointer pVVar14;
  int iVar15;
  difference_type __n;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  char *pcVar22;
  ulong uVar23;
  bool bVar24;
  vector<bool,_std::allocator<bool>_> needs_derivative;
  vector<bool,_std::allocator<bool>_> in_computation;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs;
  allocator_type local_a9;
  vector<bool,_std::allocator<bool>_> local_a8;
  ulong local_78;
  vector<bool,_std::allocator<bool>_> local_70;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> local_48;
  
  uVar18 = from_where->t;
  uVar17 = (ulong)uVar18;
  uVar21 = (ulong)(uVar18 + 1);
  pTVar3 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) *
             -0x71c71c71c71c71c7) < uVar21) {
    __assert_fail("from_where+1 <= nfxs.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/exec.cc"
                  ,0x56,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
  }
  pCVar4 = (this->super_ExecutionEngine).cg;
  if ((ulong)((long)(pCVar4->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar4->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) < uVar21) {
    __assert_fail("from_where+1 <= cg.nodes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/exec.cc"
                  ,0x57,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
  }
  uVar19 = (ulong)pTVar3[uVar17].d.nd;
  iVar15 = 1;
  if (uVar19 != 0) {
    uVar20 = 0;
    do {
      iVar15 = iVar15 * pTVar3[uVar17].d.d[uVar20];
      uVar20 = uVar20 + 1;
    } while (uVar19 != uVar20);
  }
  if (iVar15 * pTVar3[uVar17].d.bd == 1) {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::resize(&this->ndEdfs,uVar21);
    dEdfs->used = 0;
    if (uVar21 != 0) {
      uVar19 = 0;
      do {
        pTVar5 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = pTVar5[uVar19].d.bd;
        local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage =
             (_Bit_pointer)
             CONCAT44(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage._4_4_,uVar2);
        pTVar3 = pTVar5 + uVar19;
        puVar1 = pTVar5[uVar19].d.d + 4;
        local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = *(_Bit_type **)puVar1;
        local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = *(_Bit_type **)(pTVar3->d).d;
        local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = (pTVar3->d).d[2];
        local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._12_4_ = (pTVar3->d).d[3];
        pTVar3 = (this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar9 = *(undefined8 *)pTVar5[uVar19].d.d;
        uVar10 = *(undefined8 *)(pTVar5[uVar19].d.d + 2);
        puVar1 = pTVar5[uVar19].d.d + 4;
        uVar11 = *(undefined8 *)puVar1;
        uVar12 = *(undefined8 *)(puVar1 + 2);
        pTVar3[uVar19].d.bd = pTVar5[uVar19].d.bd;
        puVar1 = pTVar3[uVar19].d.d + 4;
        *(undefined8 *)puVar1 = uVar11;
        *(undefined8 *)(puVar1 + 2) = uVar12;
        *(undefined8 *)pTVar3[uVar19].d.d = uVar9;
        *(undefined8 *)(pTVar3[uVar19].d.d + 2) = uVar10;
        uVar20 = (ulong)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ >> 0x20;
        iVar15 = 1;
        if (uVar20 != 0) {
          uVar16 = 0;
          do {
            iVar15 = iVar15 * *(int *)((long)&local_a8.super__Bvector_base<std::allocator<bool>_>.
                                              _M_impl.super__Bvector_impl_data._M_start.
                                              super__Bit_iterator_base._M_p + uVar16 * 4);
            uVar16 = uVar16 + 1;
          } while (uVar20 != uVar16);
        }
        pfVar13 = (float *)AlignedMemoryPool::allocate(dEdfs,(ulong)(iVar15 * uVar2) << 2);
        (this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_start[uVar19].v = pfVar13;
        if (pfVar13 == (float *)0x0) {
          pcVar22 = "out of memory while attempting to allocate space for derivatives\n";
          goto LAB_0018ebec;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar21);
    }
    if (dEdfs->used != 0) {
      (*dEdfs->a->_vptr_MemAllocator[4])(dEdfs->a,dEdfs->mem);
    }
    (this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].v = kSCALAR_ONE;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
         0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_a8,uVar21,(bool *)&local_70,(allocator_type *)&local_48);
    pCVar4 = (this->super_ExecutionEngine).cg;
    pVVar6 = (pCVar4->parameter_nodes).
             super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pVVar14 = (pCVar4->parameter_nodes).
                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                   _M_impl.super__Vector_impl_data._M_start; pVVar14 != pVVar6;
        pVVar14 = pVVar14 + 1) {
      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[pVVar14->t >> 6] =
           local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[pVVar14->t >> 6] | 1L << ((byte)pVVar14->t & 0x3f)
      ;
    }
    if (uVar21 != 0) {
      ppNVar7 = (pCVar4->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar19 = 0;
      do {
        uVar16 = 1L << ((byte)uVar19 & 0x3f);
        uVar20 = local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar19 >> 6];
        bVar24 = (uVar20 >> (uVar19 & 0x3f) & 1) != 0;
        pNVar8 = ppNVar7[uVar19];
        for (pVVar14 = *(pointer *)
                        &(pNVar8->args).
                         super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                         ._M_impl;
            pVVar14 !=
            (pNVar8->args).
            super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
            super__Vector_impl_data._M_finish; pVVar14 = pVVar14 + 1) {
          bVar24 = (bool)(bVar24 | (local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                    [pVVar14->t >> 6] >> ((ulong)pVVar14->t & 0x3f) & 1) != 0);
        }
        uVar23 = uVar20 | uVar16;
        if (!bVar24) {
          uVar23 = ~uVar16 & uVar20;
        }
        local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar19 >> 6] = uVar23;
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar21);
    }
    local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_48.
                          super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_70,uVar21,(bool *)&local_48,&local_a9);
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p[uVar18 >> 6] =
         local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[uVar18 >> 6] | 1L << ((byte)uVar18 & 0x3f);
    local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (-1 < (int)uVar18) {
      do {
        local_78 = uVar17;
        if ((local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0) {
          pNVar8 = (((this->super_ExecutionEngine).cg)->nodes).
                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar17];
          std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::resize
                    (&local_48,
                     (ulong)((long)(pNVar8->args).
                                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pNVar8->args).
                                  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
          uVar17 = local_78;
          pVVar14 = (pNVar8->args).
                    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pVVar6 = (pNVar8->args).
                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pVVar14 != pVVar6) {
            uVar21 = 0;
            do {
              uVar18 = pVVar14->t;
              local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar18 >> 6] =
                   local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar18 >> 6] |
                   1L << ((byte)uVar18 & 0x3f);
              local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar21] =
                   (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar18;
              uVar21 = (ulong)((int)uVar21 + 1);
              pVVar14 = pVVar14 + 1;
            } while (pVVar14 != pVVar6);
          }
          pVVar14 = (pNVar8->args).
                    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pVVar6 = (pNVar8->args).
                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pVVar14 != pVVar6) {
            uVar18 = 0;
            do {
              uVar2 = pVVar14->t;
              if ((local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] >>
                   ((ulong)uVar2 & 0x3f) & 1) != 0) {
                pTVar3 = (this->ndEdfs).
                         super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                         super__Vector_impl_data._M_start;
                Node::backward(pNVar8,&local_48,
                               (this->nfxs).
                               super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl
                               .super__Vector_impl_data._M_start + uVar17,pTVar3 + uVar17,uVar18,
                               pTVar3 + uVar2);
              }
              uVar18 = uVar18 + 1;
              pVVar14 = pVVar14 + 1;
            } while (pVVar14 != pVVar6);
          }
        }
        uVar17 = local_78 - 1;
      } while (0 < (long)local_78);
    }
    pCVar4 = (this->super_ExecutionEngine).cg;
    pVVar6 = (pCVar4->parameter_nodes).
             super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pVVar14 = (pCVar4->parameter_nodes).
                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                   _M_impl.super__Vector_impl_data._M_start; pVVar14 != pVVar6;
        pVVar14 = pVVar14 + 1) {
      pNVar8 = (((this->super_ExecutionEngine).cg)->nodes).
               super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
               super__Vector_impl_data._M_start[pVVar14->t];
      (*pNVar8->_vptr_Node[10])
                (pNVar8,(this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>
                        ._M_impl.super__Vector_impl_data._M_start + pVVar14->t);
    }
    if (local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    return;
  }
  pcVar22 = "backward() called on non-scalar node.\n";
LAB_0018ebec:
  std::operator<<((ostream *)&std::cerr,pcVar22);
  abort();
}

Assistant:

void SimpleExecutionEngine::backward(VariableIndex from_where) {
  assert(from_where+1 <= nfxs.size());
  assert(from_where+1 <= cg.nodes.size());
  if (nfxs[from_where].d.size() != 1) {
    cerr << "backward() called on non-scalar node.\n";
    abort();
  }

  const unsigned num_nodes = from_where+1;
  ndEdfs.resize(num_nodes);
  dEdfs->free();
  for (unsigned i = 0; i < num_nodes; ++i) {
    const auto dim = nfxs[i].d;
    ndEdfs[i].d = dim;
    ndEdfs[i].v = static_cast<float*>(dEdfs->allocate(dim.size() * sizeof(float)));
    if (!ndEdfs[i].v) {
      cerr << "out of memory while attempting to allocate space for derivatives\n";
      abort();
    }
  }
  dEdfs->zero_allocated_memory();
  // initialize dE/dE = 1
  ndEdfs.back().v = kSCALAR_ONE;

  // here we find constant paths to avoid doing extra work
  // by default, a node is constant unless
  //   1) it is a parameter node
  //   2) it depends on a non-constant node
  // (thus, functions of constants and inputs end up being
  //  false in this computation)
  vector<bool> needs_derivative(num_nodes, false);
  for (auto i : cg.parameter_nodes)
    needs_derivative[i] = true;

  for (unsigned ni = 0; ni < num_nodes; ++ni) {
    bool nd = needs_derivative[ni];
    for (auto arg : cg.nodes[ni]->args)
      nd |= needs_derivative[arg];
    needs_derivative[ni] = nd;
  }

  // loop in reverse topological order
  // consider only nodes that participate in the computation.
  vector<bool> in_computation(num_nodes, false);
  in_computation[num_nodes - 1] = true;
  vector<const Tensor*> xs;
  for (int i = num_nodes - 1; i >= 0; --i) {
    if (!in_computation[i]) continue;
    const Node* node = cg.nodes[i];
    xs.resize(node->arity());
    unsigned ai = 0;
    for (VariableIndex arg : node->args) {
      in_computation[arg] = true;
      xs[ai] = &nfxs[arg];
      ++ai;
    }
    ai = 0;
    for (VariableIndex arg : node->args) {
      if (needs_derivative[arg]) {
        node->backward(xs, nfxs[i], ndEdfs[i], ai, ndEdfs[arg]);
      }
      ++ai;
    }
  }

  // accumulate gradients into parameters
  // this is simpler than you might find in some other frameworks
  // since we assume parameters come into the graph as a "function"
  // that returns the current value of the parameters
  for (VariableIndex i : cg.parameter_nodes)
    static_cast<ParameterNodeBase*>(cg.nodes[i])->accumulate_grad(ndEdfs[i]);
}